

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

int envy_bios_parse_power_unk44(envy_bios *bios)

{
  uint uVar1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = (bios->power).unk44.offset;
  iVar4 = -0x16;
  if ((ulong)uVar1 != 0) {
    if (uVar1 < bios->length) {
      uVar2 = bios->data[uVar1];
      (bios->power).unk44.version = uVar2;
    }
    else {
      (bios->power).unk44.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar2 = (bios->power).unk44.version;
    }
    if (uVar2 == '\x10') {
      uVar3 = (bios->power).unk44.offset + 1;
      uVar1 = bios->length;
      if (uVar3 < uVar1) {
        (bios->power).unk44.hlen = bios->data[uVar3];
      }
      else {
        (bios->power).unk44.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n",(ulong)uVar3);
      }
      (bios->power).unk44.valid = uVar3 < uVar1;
      iVar4 = 0;
    }
    else {
      envy_bios_parse_power_unk44_cold_1();
    }
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_power_unk44(struct envy_bios *bios) {
	struct envy_bios_power_unk44 *unk44 = &bios->power.unk44;
	int err = 0;

	if (!unk44->offset)
		return -EINVAL;

	bios_u8(bios, unk44->offset + 0x0, &unk44->version);
	switch(unk44->version) {
	case 0x10:
		err |= bios_u8(bios, unk44->offset + 0x1, &unk44->hlen);

		/* it doesn't appear as if this table has entries at all */
		unk44->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown PERF TEST SPEC table version 0x%x\n", unk44->version);
		return -EINVAL;
	};

	return 0;
}